

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O3

void printf32mem(MCInst *MI,uint OpNo,SStream *O)

{
  cs_mode cVar1;
  uint8_t uVar2;
  uint uVar3;
  
  uVar3 = MCInst_getOpcode(MI);
  if (uVar3 - 0x2f9 < 2) {
    SStream_concat0(O,"tbyte ptr ");
    uVar2 = '\n';
  }
  else if ((uVar3 == 0x309) || (uVar3 == 0x329)) {
    cVar1 = MI->csh->mode;
    if (cVar1 == CS_MODE_16) {
      uVar2 = '\x0e';
    }
    else {
      if ((cVar1 != CS_MODE_64) && (cVar1 != CS_MODE_32)) goto LAB_0023b898;
      uVar2 = '\x1c';
    }
  }
  else {
    SStream_concat0(O,"dword ptr ");
    uVar2 = '\x04';
  }
  MI->x86opsize = uVar2;
LAB_0023b898:
  printMemReference(MI,OpNo,O);
  return;
}

Assistant:

static void printf32mem(MCInst *MI, unsigned OpNo, SStream *O)
{
	switch(MCInst_getOpcode(MI)) {
		default:
			MI->x86opsize = 4;
			break;
		case X86_FBSTPm:
		case X86_FBLDm:
			// TODO: fix this in tablegen instead
			MI->x86opsize = 10;
			break;
		case X86_FSTENVm:
		case X86_FLDENVm:
			// TODO: fix this in tablegen instead
			switch(MI->csh->mode) {
				default:    // never reach
					break;
				case CS_MODE_16:
					MI->x86opsize = 14;
					break;
				case CS_MODE_32:
				case CS_MODE_64:
					MI->x86opsize = 28;
					break;
			}
			break;
	}

	printMemReference(MI, OpNo, O);
}